

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

bool __thiscall Polymer::CheckTermination(Polymer *this,int pol_index)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  string *psVar6;
  SpeciesTracker *this_00;
  element_type *peVar7;
  FixedElement *pFVar8;
  element_type *peVar9;
  string *p_2;
  double extraout_XMM0_Qa;
  double dVar10;
  __type local_226;
  undefined1 local_180 [24];
  undefined1 local_168 [4];
  int i;
  Ptr transcript;
  int dist;
  double random_num;
  string local_140;
  reference local_120;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval;
  iterator __end1;
  iterator __begin1;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  *__range1;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [24];
  string local_a8 [32];
  shared_ptr<MobileElement> local_88;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  undefined1 local_30 [8];
  Ptr pol;
  int pol_index_local;
  Polymer *this_local;
  
  pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       pol_index;
  MobileElementManager::GetPol((MobileElementManager *)local_30,(int)this + 0x90);
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  iVar3 = MobileElement::stop(peVar5);
  if (iVar3 < this->stop_) {
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
              *)&__range1);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    iVar3 = MobileElement::start(peVar5);
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    iVar4 = MobileElement::stop(peVar5);
    IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
              (&this->release_sites_,(long)iVar3,(long)iVar4,(intervalVector *)&__range1);
    __end1 = std::
             vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             ::begin((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                      *)&__range1);
    interval = (Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *)
               std::
               vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               ::end((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                      *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
                                       *)&interval), bVar1) {
      local_120 = __gnu_cxx::
                  __normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
                  ::operator*(&__end1);
      peVar7 = std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_120->value);
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      bVar1 = false;
      psVar6 = MobileElement::name_abi_cxx11_(peVar5);
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      iVar3 = MobileElement::reading_frame(peVar5);
      bVar2 = ReleaseSite::CheckInteraction(peVar7,psVar6,iVar3);
      local_226 = false;
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_120->value);
        bVar2 = ReleaseSite::readthrough(peVar7);
        local_226 = false;
        if (!bVar2) {
          peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          MobileElement::gene_bound_abi_cxx11_(&local_140,peVar5);
          bVar1 = true;
          pFVar8 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_120->value)->super_FixedElement;
          psVar6 = FixedElement::gene_abi_cxx11_(pFVar8);
          local_226 = std::operator==(&local_140,psVar6);
        }
      }
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_140);
      }
      if (local_226 != false) {
        Random::random();
        peVar7 = std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_120->value);
        peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        psVar6 = MobileElement::name_abi_cxx11_(peVar5);
        dVar10 = ReleaseSite::efficiency(peVar7,psVar6);
        if (dVar10 < extraout_XMM0_Qa) {
          pFVar8 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_120->value)->super_FixedElement;
          FixedElement::Cover(pFVar8);
          pFVar8 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_120->value)->super_FixedElement;
          FixedElement::ResetState(pFVar8);
          peVar7 = std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_120->value);
          ReleaseSite::readthrough(peVar7,true);
          goto LAB_00120f9c;
        }
        pFVar8 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_120->value)->super_FixedElement;
        iVar3 = FixedElement::stop(pFVar8);
        peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        iVar4 = MobileElement::stop(peVar5);
        transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
             (iVar3 - iVar4) + 1;
        MobileElementManager::GetAttached((MobileElementManager *)local_168,(int)this + 0x90);
        bVar1 = std::operator!=((shared_ptr<Polymer> *)local_168,(nullptr_t)0x0);
        if (bVar1) {
          for (local_180._20_4_ = 0;
              (int)local_180._20_4_ <
              transcript.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _4_4_; local_180._20_4_ = local_180._20_4_ + 1) {
            peVar9 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_168);
            (*peVar9->_vptr_Polymer[2])();
          }
          peVar9 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_168);
          attached(peVar9,false);
        }
        wrapper((Polymer *)local_180);
        peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        psVar6 = MobileElement::name_abi_cxx11_(peVar5);
        pFVar8 = &std::__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ReleaseSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_120->value)->super_FixedElement;
        p_2 = FixedElement::gene_abi_cxx11_(pFVar8);
        Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::Emit(&this->termination_signal_,(shared_ptr<PolymerWrapper> *)local_180,psVar6,p_2);
        std::shared_ptr<PolymerWrapper>::~shared_ptr((shared_ptr<PolymerWrapper> *)local_180);
        MobileElementManager::Delete
                  (&this->polymerases_,
                   pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_);
        this_local._7_1_ = true;
        local_50._16_4_ = 1;
        std::shared_ptr<Polymer>::~shared_ptr((shared_ptr<Polymer> *)local_168);
        goto LAB_00120fba;
      }
LAB_00120f9c:
      __gnu_cxx::
      __normal_iterator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = false;
    local_50._16_4_ = 1;
LAB_00120fba:
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               *)&__range1);
  }
  else {
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    psVar6 = MobileElement::name_abi_cxx11_(peVar5);
    bVar1 = std::operator==(psVar6,"__rnase");
    if (bVar1) {
      MobileElementManager::Delete
                (&this->polymerases_,
                 pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 ._4_4_);
      this->degrade_ = true;
      this_local._7_1_ = true;
      local_50._16_4_ = 1;
    }
    else {
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      bVar1 = MobileElement::polymerasereadthrough(peVar5);
      if (bVar1) {
        wrapper((Polymer *)local_50);
        peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        psVar6 = MobileElement::name_abi_cxx11_(peVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_70,"NA",&local_71);
        Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::Emit(&this->termination_signal_,(shared_ptr<PolymerWrapper> *)local_50,psVar6,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        std::shared_ptr<PolymerWrapper>::~shared_ptr((shared_ptr<PolymerWrapper> *)local_50);
        MobileElementManager::Delete
                  (&this->polymerases_,
                   pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_);
        this_00 = SpeciesTracker::Instance();
        peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        psVar6 = MobileElement::name_abi_cxx11_(peVar5);
        SpeciesTracker::Increment(this_00,psVar6,-1);
        std::shared_ptr<MobileElement>::shared_ptr(&local_88,(shared_ptr<MobileElement> *)local_30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"readthrough",(allocator *)(local_c0 + 0x17));
        (*this->_vptr_Polymer[1])(this,&local_88,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x17));
        std::shared_ptr<MobileElement>::~shared_ptr(&local_88);
        this_local._7_1_ = true;
        local_50._16_4_ = 1;
      }
      else {
        wrapper((Polymer *)local_c0);
        peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        psVar6 = MobileElement::name_abi_cxx11_(peVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_e0,"NA",
                   (allocator *)
                   ((long)&results.
                           super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::Emit(&this->termination_signal_,(shared_ptr<PolymerWrapper> *)local_c0,psVar6,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&results.
                           super__Vector_base<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::shared_ptr<PolymerWrapper>::~shared_ptr((shared_ptr<PolymerWrapper> *)local_c0);
        MobileElementManager::Delete
                  (&this->polymerases_,
                   pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_);
        this_local._7_1_ = true;
        local_50._16_4_ = 1;
      }
    }
  }
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Polymer::CheckTermination(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index);
  if (pol->stop() >= stop_) {
    if (pol->name() == "__rnase") {
      // std::cout << "rnase ran off end of transcript" << std::endl;
      polymerases_.Delete(pol_index);
      degrade_ = true;
      return true;
    } else if (pol->polymerasereadthrough()) {
      // Create a new transcript and unbind/rebind pol so that
      // all necessary checks still occur
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      // The termination signal increments the pol count by 1,
      // so decrement it here since the polymerase was actually
      // just moved to the beginning of the genome
      SpeciesTracker::Instance().Increment(pol->name(), -1);
      Bind(pol, "readthrough"); 
      return true;
    } else {
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      return true;
    }
  }
  std::vector<Interval<ReleaseSite::Ptr>> results;
  release_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    if (interval.value->CheckInteraction(pol->name(), pol->reading_frame()) &&
        !interval.value->readthrough() &&
        pol->gene_bound() == interval.value->gene()) {
      // terminate
      // std::cout << pol->name() + " " + interval.value->name() << std::endl;
      double random_num = Random::random();
      if (random_num <= interval.value->efficiency(pol->name())) {
        // std::cout << pol->name() + " terminating" << std::endl;
        // Fire Emit signal until entire terminator is uncovered
        // Coordinates are inclusive, so must add 1 after calculating
        // difference
        int dist = interval.value->stop() - pol->stop() + 1;
        auto transcript = polymerases_.GetAttached(pol_index);
        if (transcript != nullptr) {
          for (int i = 0; i < dist; i++) {
            transcript->ShiftMask();
          }
          transcript->attached(false);
        }
        termination_signal_.Emit(wrapper(), pol->name(),
                                 interval.value->gene());
        polymerases_.Delete(pol_index);
        return true;
      } else {
        interval.value->Cover();
        interval.value->ResetState();
        // std::cout << "Readthrough set to true!" << std::endl;
        interval.value->readthrough(true);
      }
    }
  }
  return false;
}